

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLimitReadFile.cpp
# Opt level: O1

void __thiscall
irr::io::CLimitReadFile::CLimitReadFile
          (CLimitReadFile *this,void **vtt,IReadFile *alreadyOpenedFile,long pos,long areaSize,
          path *name)

{
  _func_int **pp_Var1;
  undefined1 *puVar2;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_IReadFile)._vptr_IReadFile = pp_Var1;
  *(void **)((long)&(this->super_IReadFile)._vptr_IReadFile + (long)pp_Var1[-3]) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IReadFile)._vptr_IReadFile = pp_Var1;
  *(void **)((long)&(this->super_IReadFile)._vptr_IReadFile + (long)pp_Var1[-3]) = vtt[3];
  puVar2 = &(this->super_IReadFile).field_0x8;
  *(undefined1 **)&(this->super_IReadFile).field_0x8 = &(this->super_IReadFile).field_0x18;
  *(undefined8 *)&(this->super_IReadFile).field_0x10 = 0;
  (this->super_IReadFile).field_0x18 = 0;
  if ((path *)puVar2 != name) {
    ::std::__cxx11::string::_M_assign((string *)puVar2);
  }
  this->AreaStart = 0;
  this->AreaEnd = 0;
  this->Pos = 0;
  this->File = alreadyOpenedFile;
  if (alreadyOpenedFile != (IReadFile *)0x0) {
    *(int *)(&alreadyOpenedFile->field_0x10 + (long)alreadyOpenedFile->_vptr_IReadFile[-3]) =
         *(int *)(&alreadyOpenedFile->field_0x10 + (long)alreadyOpenedFile->_vptr_IReadFile[-3]) + 1
    ;
    this->AreaStart = pos;
    this->AreaEnd = areaSize + pos;
  }
  return;
}

Assistant:

CLimitReadFile::CLimitReadFile(IReadFile *alreadyOpenedFile, long pos,
		long areaSize, const io::path &name) :
		Filename(name),
		AreaStart(0), AreaEnd(0), Pos(0),
		File(alreadyOpenedFile)
{
#ifdef _DEBUG
	setDebugName("CLimitReadFile");
#endif

	if (File) {
		File->grab();
		AreaStart = pos;
		AreaEnd = AreaStart + areaSize;
	}
}